

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  bool bVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmGlobalNinjaGenerator *this_01;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *deptype;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  deptype = lang;
  lang_local = (string *)this;
  this_00 = GetMakefile(this);
  std::operator+(&local_48,"CMAKE_NINJA_DEPTYPE_",deptype);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = psVar2;
  bVar1 = std::operator==(psVar2,"msvc");
  if (bVar1) {
    return true;
  }
  bVar1 = std::operator==(local_28,"intel");
  if (bVar1) {
    this_01 = GetGlobalGenerator(this);
    bVar1 = cmGlobalNinjaGenerator::SupportsMultilineDepfile(this_01);
    if (!bVar1) {
      return true;
    }
    psVar2 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    lVar3 = std::__cxx11::string::find((char)psVar2,0x20);
    if (lVar3 == -1) {
      psVar2 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).Makefile);
      lVar3 = std::__cxx11::string::find((char)psVar2,0x20);
      if (lVar3 == -1) goto LAB_00403597;
    }
    this_local._7_1_ = true;
  }
  else {
LAB_00403597:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  std::string const& deptype =
    this->GetMakefile()->GetSafeDefinition("CMAKE_NINJA_DEPTYPE_" + lang);
  if (deptype == "msvc") {
    return true;
  }
  if (deptype == "intel") {
    // Ninja does not really define "intel", but we use it to switch based
    // on whether this environment supports "gcc" or "msvc" deptype.
    if (!this->GetGlobalGenerator()->SupportsMultilineDepfile()) {
      // This ninja version is too old to support the Intel depfile format.
      // Fall back to msvc deptype.
      return true;
    }
    if ((this->Makefile->GetHomeDirectory().find(' ') != std::string::npos) ||
        (this->Makefile->GetHomeOutputDirectory().find(' ') !=
         std::string::npos)) {
      // The Intel compiler does not properly escape spaces in a depfile.
      // Fall back to msvc deptype.
      return true;
    }
  }
  return false;
}